

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adinput.c
# Opt level: O3

int set_diomask(uchar enable)

{
  int iVar1;
  size_t sVar2;
  undefined7 in_register_00000039;
  char buf [2048];
  uint local_818;
  ushort local_814;
  
  dio_num = 0;
  local_818 = 0xa0a0a0a;
  local_814 = local_814 & 0xff00;
  sVar2 = strlen((char *)&local_818);
  serial_write((char *)&local_818,(int)sVar2);
  yp_usleep(50000);
  serial_flush_in();
  yp_usleep(50000);
  local_814 = 0x4f;
  local_818 = 0x49544547;
  sVar2 = strlen((char *)&local_818);
  if ((int)CONCAT71(in_register_00000039,enable) == 0) {
    *(undefined2 *)((long)&local_818 + sVar2) = 0x30;
  }
  else {
    *(undefined2 *)((long)&local_818 + sVar2) = 0x31;
    dio_num = dio_num + 1;
  }
  sVar2 = strlen((char *)&local_818);
  *(undefined2 *)((long)&local_818 + sVar2) = 10;
  sVar2 = strlen((char *)&local_818);
  serial_write((char *)&local_818,(int)sVar2);
  local_818 = local_818 & 0xffffff00;
  iVar1 = serial_recieve(admask_receive,&local_818);
  return (int)(iVar1 == -1);
}

Assistant:

int set_diomask(unsigned char enable)
{
  /* Send & Recive Buffer */
  char buf[2048];
  dio_num = 0;

  strcpy(buf, "\n\n\n\n");
  serial_write(buf, strlen(buf));
  yp_usleep(50000);
  serial_flush_in();
  yp_usleep(50000);
  strcpy(buf, "GETIO");
  if (enable)
  {
    strcat(buf, "1");
    dio_num++;
  }
  else
    strcat(buf, "0");
  strcat(buf, "\n");
  serial_write(buf, strlen(buf));

  buf[0] = 0;
  if (serial_recieve(admask_receive, buf) == -1)
    return 1;

  return 0;
}